

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall amrex::AmrLevel::removeOldData(AmrLevel *this)

{
  int iVar1;
  int i;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    iVar2 = local_c;
    iVar1 = DescriptorList::size((DescriptorList *)0x139731f);
    if (iVar1 <= iVar2) break;
    Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    StateData::removeOldData((StateData *)0x1397347);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void
AmrLevel::removeOldData ()
{
    for (int i = 0; i < desc_lst.size(); i++)
    {
        state[i].removeOldData();
    }
}